

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O2

int CfdFreeBlockHandle(void *handle,void *block_handle)

{
  allocator local_39;
  string local_38;
  
  cfd::Initialize();
  if (block_handle != (void *)0x0) {
    std::__cxx11::string::string((string *)&local_38,"BlockOpe",&local_39);
    cfd::capi::CheckBuffer(block_handle,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (*(long **)((long)block_handle + 0x18) != (long *)0x0) {
      (**(code **)(**(long **)((long)block_handle + 0x18) + 8))();
      *(undefined8 *)((long)block_handle + 0x18) = 0;
    }
  }
  std::__cxx11::string::string((string *)&local_38,"BlockOpe",&local_39);
  cfd::capi::FreeBuffer(block_handle,&local_38,0x20);
  std::__cxx11::string::~string((string *)&local_38);
  return 0;
}

Assistant:

int CfdFreeBlockHandle(void* handle, void* block_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (block_handle != nullptr) {
      CheckBuffer(block_handle, kPrefixBlock);
      CfdCapiBlockData* data = static_cast<CfdCapiBlockData*>(block_handle);
      if (data->block != nullptr) {
        delete data->block;
        data->block = nullptr;
      }
    }
    FreeBuffer(block_handle, kPrefixBlock, sizeof(CfdCapiBlockData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}